

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O0

SnapShot * TTD::SnapShot::ParseSnapshotFromFile(FileReader *reader)

{
  unsigned_long uVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 uVar4;
  HeapAllocator *alloc;
  SnapShot *pSVar5;
  SnapContext *intoCtx;
  SlabAllocator *pSVar6;
  TTD_LOG_PTR_ID TVar7;
  UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL> *list;
  UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL> *list_00;
  SnapHandler *pSVar8;
  UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL> *list_01;
  SnapType *pSVar9;
  FunctionBodyResolveInfo *fbInfo;
  UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL> *list_02;
  SnapObject *snpObject;
  UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL> *list_03;
  UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL> *list_04;
  SnapObject *into_1;
  uint32 i_3;
  uint32 objCount;
  FunctionBodyResolveInfo *into;
  uint32 i_2;
  uint32 bodyCount;
  undefined1 local_118 [8];
  Iterator iter_1;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> typeMap;
  undefined1 local_c8 [8];
  Iterator iter;
  undefined1 local_90 [8];
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> handlerMap;
  PropertyId *symid;
  uint32 i_1;
  uint32 tcSymbolCount;
  SnapContext *snpCtx;
  uint32 i;
  uint32 ctxCount;
  TrackAllocData local_40;
  SnapShot *local_18;
  SnapShot *snap;
  FileReader *reader_local;
  
  snap = (SnapShot *)reader;
  (*reader->_vptr_FileReader[6])();
  FileReader::ReadDouble((FileReader *)snap,timeTotal,false);
  FileReader::ReadUInt64((FileReader *)snap,usedMemory,true);
  FileReader::ReadUInt64((FileReader *)snap,reservedMemory,true);
  FileReader::ReadDouble((FileReader *)snap,timeGC,true);
  FileReader::ReadDouble((FileReader *)snap,timeMark,true);
  FileReader::ReadDouble((FileReader *)snap,timeExtract,true);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTSnapshot.cpp"
             ,0x71);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
  pSVar5 = (SnapShot *)new<Memory::HeapAllocator>(0x1f8,alloc,true,0x469be0);
  SnapShot(pSVar5,0.0);
  local_18 = TTD_MEM_ALLOC_CHECK<TTD::SnapShot>(pSVar5);
  uVar3 = FileReader::ReadLengthValue((FileReader *)snap,true);
  FileReader::ReadSequenceStart_WDefaultKey((FileReader *)snap,true);
  for (snpCtx._0_4_ = 0; (uint)snpCtx < uVar3; snpCtx._0_4_ = (uint)snpCtx + 1) {
    intoCtx = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::NextOpenEntry
                        (&local_18->m_ctxList);
    pSVar5 = snap;
    pSVar6 = GetSnapshotSlabAllocator(local_18);
    NSSnapValues::ParseSnapContext(intoCtx,(uint)snpCtx != 0,(FileReader *)pSVar5,pSVar6);
  }
  (**(code **)((snap->m_slabAllocator).m_currPos + 0x28))();
  uVar3 = FileReader::ReadLengthValue((FileReader *)snap,true);
  FileReader::ReadSequenceStart_WDefaultKey((FileReader *)snap,true);
  for (symid._0_4_ = 0; (uint)symid < uVar3; symid._0_4_ = (uint)symid + 1) {
    handlerMap._24_8_ =
         UnorderedArrayList<int,_32UL>::NextOpenEntry(&local_18->m_tcSymbolRegistrationMapContents);
    uVar4 = (**(code **)((snap->m_slabAllocator).m_currPos + 0x60))(snap,(uint)symid != 0);
    *(undefined4 *)handlerMap._24_8_ = uVar4;
  }
  (**(code **)((snap->m_slabAllocator).m_currPos + 0x28))();
  TVar7 = FileReader::ReadLogTag((FileReader *)snap,ctxTag,true);
  pSVar5 = snap;
  local_18->m_activeScriptContext = TVar7;
  list = &local_18->m_rootList;
  pSVar6 = GetSnapshotSlabAllocator(local_18);
  ParseListHelper<void(*)(TTD::NSSnapValues::SnapRootInfoEntry*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&),TTD::NSSnapValues::SnapRootInfoEntry,512ul>
            (SnapRootPinEntryParse,list,(FileReader *)pSVar5,pSVar6);
  pSVar5 = snap;
  list_00 = &local_18->m_handlerList;
  pSVar6 = GetSnapshotSlabAllocator(local_18);
  ParseListHelper<void(*)(TTD::NSSnapType::SnapHandler*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&),TTD::NSSnapType::SnapHandler,2048ul>
            (NSSnapType::ParseSnapHandler,list_00,(FileReader *)pSVar5,pSVar6);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::TTDIdentifierDictionary
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *)local_90);
  uVar3 = UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::Count(&local_18->m_handlerList);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::Initialize
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *)local_90,
             uVar3);
  UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::GetIterator
            ((Iterator *)local_c8,&local_18->m_handlerList);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::Iterator::IsValid
                      ((Iterator *)local_c8);
    pSVar5 = snap;
    if (!bVar2) break;
    pSVar8 = UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::Iterator::Current
                       ((Iterator *)local_c8);
    uVar1 = pSVar8->HandlerId;
    typeMap._24_8_ =
         UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::Iterator::Current
                   ((Iterator *)local_c8);
    TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::AddItem
              ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *)local_90,
               uVar1,(SnapHandler **)&typeMap.m_count);
    UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::Iterator::MoveNext
              ((Iterator *)local_c8);
  }
  list_01 = &local_18->m_typeList;
  pSVar6 = GetSnapshotSlabAllocator(local_18);
  ParseListHelper_WMap<void(*)(TTD::NSSnapType::SnapType*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&,TTD::TTDIdentifierDictionary<unsigned_long,TTD::NSSnapType::SnapHandler*>const&),TTD::NSSnapType::SnapType,TTD::NSSnapType::SnapHandler*,2048ul>
            (NSSnapType::ParseSnapType,list_01,(FileReader *)pSVar5,pSVar6,
             (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *)local_90);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::TTDIdentifierDictionary
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)
             &iter_1.m_currEntry);
  uVar3 = UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::Count(&local_18->m_typeList);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::Initialize
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)
             &iter_1.m_currEntry,uVar3);
  UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::GetIterator
            ((Iterator *)local_118,&local_18->m_typeList);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::Iterator::IsValid
                      ((Iterator *)local_118);
    if (!bVar2) break;
    pSVar9 = UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::Iterator::Current
                       ((Iterator *)local_118);
    uVar1 = pSVar9->TypePtrId;
    _i_2 = UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::Iterator::Current
                     ((Iterator *)local_118);
    TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::AddItem
              ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)
               &iter_1.m_currEntry,uVar1,(SnapType **)&i_2);
    UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::Iterator::MoveNext((Iterator *)local_118)
    ;
  }
  uVar3 = FileReader::ReadLengthValue((FileReader *)snap,true);
  FileReader::ReadSequenceStart_WDefaultKey((FileReader *)snap,true);
  for (into._0_4_ = 0; (uint)into < uVar3; into._0_4_ = (uint)into + 1) {
    fbInfo = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::NextOpenEntry
                       (&local_18->m_functionBodyList);
    pSVar5 = snap;
    pSVar6 = GetSnapshotSlabAllocator(local_18);
    NSSnapValues::ParseFunctionBodyInfo(fbInfo,(uint)into != 0,(FileReader *)pSVar5,pSVar6);
  }
  (**(code **)((snap->m_slabAllocator).m_currPos + 0x28))();
  pSVar5 = snap;
  list_02 = &local_18->m_primitiveObjectList;
  pSVar6 = GetSnapshotSlabAllocator(local_18);
  ParseListHelper_WMap<void(*)(TTD::NSSnapValues::SnapPrimitiveValue*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&,TTD::TTDIdentifierDictionary<unsigned_long,TTD::NSSnapType::SnapType*>const&),TTD::NSSnapValues::SnapPrimitiveValue,TTD::NSSnapType::SnapType*,4096ul>
            (NSSnapValues::ParseSnapPrimitiveValue,list_02,(FileReader *)pSVar5,pSVar6,
             (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)
             &iter_1.m_currEntry);
  uVar3 = FileReader::ReadLengthValue((FileReader *)snap,true);
  FileReader::ReadSequenceStart_WDefaultKey((FileReader *)snap,true);
  for (into_1._0_4_ = 0; (uint)into_1 < uVar3; into_1._0_4_ = (uint)into_1 + 1) {
    snpObject = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::NextOpenEntry
                          (&local_18->m_compoundObjectList);
    pSVar5 = snap;
    pSVar6 = GetSnapshotSlabAllocator(local_18);
    NSSnapObjects::ParseObject
              (snpObject,(uint)into_1 != 0,(FileReader *)pSVar5,pSVar6,
               local_18->m_snapObjectVTableArray,
               (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)
               &iter_1.m_currEntry);
  }
  (**(code **)((snap->m_slabAllocator).m_currPos + 0x28))();
  pSVar5 = snap;
  list_03 = &local_18->m_scopeEntries;
  pSVar6 = GetSnapshotSlabAllocator(local_18);
  ParseListHelper<void(*)(TTD::NSSnapValues::ScriptFunctionScopeInfo*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&),TTD::NSSnapValues::ScriptFunctionScopeInfo,2048ul>
            (NSSnapValues::ParseScriptFunctionScopeInfo,list_03,(FileReader *)pSVar5,pSVar6);
  pSVar5 = snap;
  list_04 = &local_18->m_slotArrayEntries;
  pSVar6 = GetSnapshotSlabAllocator(local_18);
  ParseListHelper<void(*)(TTD::NSSnapValues::SlotArrayInfo*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&),TTD::NSSnapValues::SlotArrayInfo,2048ul>
            (NSSnapValues::ParseSlotArrayInfo,list_04,(FileReader *)pSVar5,pSVar6);
  FileReader::ReadDouble((FileReader *)snap,timeWrite,true);
  (**(code **)((snap->m_slabAllocator).m_currPos + 0x38))();
  pSVar5 = local_18;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::~TTDIdentifierDictionary
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)
             &iter_1.m_currEntry);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::~TTDIdentifierDictionary
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *)local_90);
  return pSVar5;
}

Assistant:

SnapShot* SnapShot::ParseSnapshotFromFile(FileReader* reader)
    {
        reader->ReadRecordStart();

        reader->ReadDouble(NSTokens::Key::timeTotal);
        reader->ReadUInt64(NSTokens::Key::usedMemory, true);
        reader->ReadUInt64(NSTokens::Key::reservedMemory, true);
        reader->ReadDouble(NSTokens::Key::timeGC, true);
        reader->ReadDouble(NSTokens::Key::timeMark, true);
        reader->ReadDouble(NSTokens::Key::timeExtract, true);

        SnapShot* snap = TT_HEAP_NEW(SnapShot, 0.0);

        uint32 ctxCount = reader->ReadLengthValue(true);
        reader->ReadSequenceStart_WDefaultKey(true);
        for(uint32 i = 0; i < ctxCount; ++i)
        {
            NSSnapValues::SnapContext* snpCtx = snap->m_ctxList.NextOpenEntry();
            NSSnapValues::ParseSnapContext(snpCtx, i != 0, reader, snap->GetSnapshotSlabAllocator());
        }
        reader->ReadSequenceEnd();

        uint32 tcSymbolCount = reader->ReadLengthValue(true);
        reader->ReadSequenceStart_WDefaultKey(true);
        for(uint32 i = 0; i < tcSymbolCount; ++i)
        {
            Js::PropertyId* symid = snap->m_tcSymbolRegistrationMapContents.NextOpenEntry();
            *symid = reader->ReadNakedUInt32(i != 0);
        }
        reader->ReadSequenceEnd();

        snap->m_activeScriptContext = reader->ReadLogTag(NSTokens::Key::ctxTag, true);
        SnapShot::ParseListHelper(&SnapShot::SnapRootPinEntryParse, snap->m_rootList, reader, snap->GetSnapshotSlabAllocator());

        ////

        SnapShot::ParseListHelper(&NSSnapType::ParseSnapHandler, snap->m_handlerList, reader, snap->GetSnapshotSlabAllocator());

        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapHandler*> handlerMap;
        handlerMap.Initialize(snap->m_handlerList.Count());
        for(auto iter = snap->m_handlerList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            handlerMap.AddItem(iter.Current()->HandlerId, iter.Current());
        }

        SnapShot::ParseListHelper_WMap(&NSSnapType::ParseSnapType, snap->m_typeList, reader, snap->GetSnapshotSlabAllocator(), handlerMap);
        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapType*> typeMap;
        typeMap.Initialize(snap->m_typeList.Count());

        for(auto iter = snap->m_typeList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            typeMap.AddItem(iter.Current()->TypePtrId, iter.Current());
        }

        ////
        uint32 bodyCount = reader->ReadLengthValue(true);
        reader->ReadSequenceStart_WDefaultKey(true);
        for(uint32 i = 0; i < bodyCount; ++i)
        {
            NSSnapValues::FunctionBodyResolveInfo* into = snap->m_functionBodyList.NextOpenEntry();
            NSSnapValues::ParseFunctionBodyInfo(into, i != 0, reader, snap->GetSnapshotSlabAllocator());
        }
        reader->ReadSequenceEnd();

        SnapShot::ParseListHelper_WMap(&NSSnapValues::ParseSnapPrimitiveValue, snap->m_primitiveObjectList, reader, snap->GetSnapshotSlabAllocator(), typeMap);

        uint32 objCount = reader->ReadLengthValue(true);
        reader->ReadSequenceStart_WDefaultKey(true);
        for(uint32 i = 0; i < objCount; ++i)
        {
            NSSnapObjects::SnapObject* into = snap->m_compoundObjectList.NextOpenEntry();
            NSSnapObjects::ParseObject(into, i != 0, reader, snap->GetSnapshotSlabAllocator(), snap->m_snapObjectVTableArray, typeMap);
        }
        reader->ReadSequenceEnd();

        ////
        SnapShot::ParseListHelper(&NSSnapValues::ParseScriptFunctionScopeInfo, snap->m_scopeEntries, reader, snap->GetSnapshotSlabAllocator());
        SnapShot::ParseListHelper(&NSSnapValues::ParseSlotArrayInfo, snap->m_slotArrayEntries, reader, snap->GetSnapshotSlabAllocator());

        reader->ReadDouble(NSTokens::Key::timeWrite, true);

        reader->ReadRecordEnd();

        return snap;
    }